

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryBuilder::verifyInt32(WasmBinaryBuilder *this,int32_t x)

{
  uint32_t uVar1;
  string local_40;
  
  uVar1 = getInt32(this);
  if (uVar1 == x) {
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"surprising value","");
  throwError(this,&local_40);
}

Assistant:

void WasmBinaryBuilder::verifyInt32(int32_t x) {
  int32_t y = getInt32();
  if (x != y) {
    throwError("surprising value");
  }
}